

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

void build_alloc_qu_error(Dwarf_Debug dbg,char *fieldname,Dwarf_Error *error)

{
  char *msg;
  dwarfstring m;
  
  dwarfstring_constructor(&m);
  dwarfstring_append_printf_s
            (&m,"DW_DLE_ALLOC_FAIL : Attempt to malloc space for %s failed",fieldname);
  msg = dwarfstring_string(&m);
  _dwarf_error_string(dbg,error,0x3e,msg);
  dwarfstring_destructor(&m);
  return;
}

Assistant:

static void
build_alloc_qu_error(Dwarf_Debug dbg,
    const char *fieldname,
    Dwarf_Error *error)
{
    dwarfstring m;

    dwarfstring_constructor(&m);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_ALLOC_FAIL :"
        " Attempt to malloc space for %s failed",
        (char *)fieldname);
    _dwarf_error_string(dbg,error,DW_DLE_ALLOC_FAIL,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}